

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O2

void Io_WriteBook(Abc_Ntk_t *pNtk,char *FileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint nCap;
  void **ppvVar4;
  Abc_Obj_t *pAVar5;
  double dVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  size_t sVar10;
  char *pcVar11;
  FILE *pFVar12;
  FILE *pFVar13;
  FILE *pFVar14;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar15;
  Abc_Obj_t *pAVar16;
  void *pvVar17;
  Vec_Ptr_t *p;
  ulong uVar18;
  ProgressBar *p_00;
  Vec_Ptr_t *p_01;
  ulong uVar19;
  long *plVar20;
  char *pcVar21;
  ulong uVar22;
  undefined8 *puVar23;
  char *extraout_RDX;
  char *extraout_RDX_00;
  int iVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint nItemsCur;
  long lVar29;
  bool bVar30;
  ulong uVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  Abc_Obj_t *local_a0;
  undefined4 local_88;
  
  sVar10 = strlen(FileName);
  pcVar11 = (char *)calloc(sVar10 + 7,1);
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0x6e,"void Io_WriteBook(Abc_Ntk_t *, char *)");
  }
  strcpy(pcVar11,FileName);
  sVar10 = strlen(pcVar11);
  builtin_strncpy(pcVar11 + sVar10,".nodes",7);
  pFVar12 = fopen(pcVar11,"w");
  strcpy(pcVar11,FileName);
  sVar10 = strlen(pcVar11);
  builtin_strncpy(pcVar11 + sVar10,".nets",6);
  pFVar13 = fopen(pcVar11,"w");
  strcpy(pcVar11,FileName);
  sVar10 = strlen(pcVar11);
  builtin_strncpy(pcVar11 + sVar10,".aux",5);
  pFVar14 = fopen(pcVar11,"w");
  if ((pFVar13 == (FILE *)0x0 || pFVar12 == (FILE *)0x0) || pFVar14 == (FILE *)0x0) {
    fclose(pFVar14);
    fwrite("Io_WriteBook(): Cannot open the output files.\n",0x2e,1,_stdout);
    return;
  }
  fprintf(pFVar14,"RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts",FileName,FileName,
          FileName,FileName,FileName);
  fclose(pFVar14);
  uVar7 = Io_NtkWriteNodes((FILE *)pFVar12,pNtk);
  Io_NtkWriteNets((FILE *)pFVar13,pNtk);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    uVar8 = Io_NtkWriteNodes((FILE *)pFVar12,pNtk);
    uVar7 = uVar7 + uVar8;
    Io_NtkWriteNets((FILE *)pFVar13,pNtk);
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                  ,0x8f,"void Io_WriteBook(Abc_Ntk_t *, char *)");
  }
  uVar31 = (ulong)uVar7;
  if (0 < pNtk->nObjCounts[10]) {
    for (iVar24 = 0; pVVar15 = pNtk->pDesign->vModules, iVar24 < pVVar15->nSize; iVar24 = iVar24 + 1
        ) {
      pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pVVar15,iVar24);
      if (pNtk_00 != pNtk) {
        uVar7 = Io_NtkWriteNodes((FILE *)pFVar12,pNtk_00);
        uVar31 = (ulong)((int)uVar31 + uVar7);
        Io_NtkWriteNets((FILE *)pFVar13,pNtk_00);
      }
    }
  }
  fclose(pFVar12);
  fclose(pFVar13);
  strcpy(pcVar11,FileName);
  sVar10 = strlen(pcVar11);
  builtin_strncpy(pcVar11 + sVar10,".scl",5);
  pFVar12 = fopen(pcVar11,"w");
  strcpy(pcVar11,FileName);
  sVar10 = strlen(pcVar11);
  builtin_strncpy(pcVar11 + sVar10,".pl",4);
  pFVar13 = fopen(pcVar11,"w");
  strcpy(pcVar11,FileName);
  sVar10 = strlen(pcVar11);
  builtin_strncpy(pcVar11 + sVar10,".wts",5);
  pFVar14 = fopen(pcVar11,"w");
  free(pcVar11);
  iVar24 = pNtk->nObjCounts[8];
  dVar32 = (double)uVar31 / 0.9;
  uVar8 = (uint)SQRT(dVar32);
  iVar1 = pNtk->nObjCounts[7];
  iVar2 = pNtk->vPis->nSize;
  iVar3 = pNtk->vPos->nSize;
  dVar33 = (double)uVar8;
  dVar6 = (double)(int)(dVar32 / dVar33);
  dVar34 = dVar33 * dVar6;
  uVar7 = 1;
  printf("Core cell height(==site height) is %d\n",1);
  uVar18 = (ulong)(uint)(iVar24 + iVar1);
  printf("Total core cell width is %d giving an ave width of %f\n",
         SUB84((double)(uVar31 / uVar18),0),uVar31,uVar31 % uVar18);
  puts("Target Dimensions:");
  printf("  Area  :   %f\n",SUB84(dVar32,0));
  printf("  WS%%   :   %f\n",0);
  printf("  AR    :   %f\n",0);
  puts("Actual Dimensions:");
  local_88 = SUB84(dVar6,0);
  printf("  Width :   %f\n",local_88);
  printf("  Height:   %f (%d rows)\n",SUB84(dVar33,0),(ulong)uVar8);
  printf("  Area  :   %f\n",SUB84(dVar34,0));
  printf("  WS%%   :   %f\n",SUB84(((dVar34 - (double)uVar31) * 100.0) / dVar34,0));
  printf("  AR    :   %f\n\n",SUB84(dVar6 / dVar33,0));
  fwrite("UCLA    scl    1.0\n\n",0x14,1,pFVar12);
  fprintf(pFVar12,"Numrows : %d\n\n",(ulong)uVar8);
  for (uVar26 = 0; uVar8 != uVar26; uVar26 = uVar26 + 1) {
    fwrite("CoreRow Horizontal\n",0x13,1,pFVar12);
    fprintf(pFVar12," Coordinate   : \t%d\n",(ulong)uVar26);
    fprintf(pFVar12," Height       : \t%d\n",1);
    fprintf(pFVar12," Sitewidth    : \t%d\n",1);
    fprintf(pFVar12," Sitespacing  : \t%d\n",1);
    fprintf(pFVar12," Siteorient   : \t%s\n",
            &DAT_007b7524 + *(int *)(&DAT_007b7524 + (ulong)(uVar26 & 1) * 4));
    fprintf(pFVar12," Sitesymmetry : \t%c\n",0x59);
    fprintf(pFVar12," SubrowOrigin : \t%d Numsites :    \t%d\n",0,(int)(dVar32 / dVar33));
    fwrite("End\n",4,1,pFVar12);
  }
  uVar26 = iVar3 + iVar2;
  pVVar15 = Vec_PtrAlloc(uVar26);
  Vec_PtrAlloc(uVar26);
  uVar8 = (uint)((dVar33 / (dVar33 + dVar33 + dVar6 + dVar6)) * (double)uVar26);
  uVar31 = (ulong)uVar8;
  uVar27 = uVar26 + uVar8 * -2;
  for (iVar24 = 0; iVar24 < pNtk->vPis->nSize; iVar24 = iVar24 + 1) {
    pAVar16 = Abc_NtkPi(pNtk,iVar24);
    Vec_PtrPush(pVVar15,pAVar16);
  }
  for (iVar24 = 0; iVar24 < pNtk->vPos->nSize; iVar24 = iVar24 + 1) {
    pAVar16 = Abc_NtkPo(pNtk,iVar24);
    Vec_PtrPush(pVVar15,pAVar16);
  }
  nCap = pVVar15->nSize;
  pvVar17 = malloc((ulong)nCap * 4);
  p = Vec_PtrAlloc(nCap);
  for (uVar18 = 0; nCap != uVar18; uVar18 = uVar18 + 1) {
    *(undefined4 *)((long)pvVar17 + uVar18 * 4) = 0;
  }
  dVar32 = ceil((double)uVar27 * 0.5);
  uVar18 = (ulong)dVar32;
  uVar27 = uVar27 - (int)uVar18;
  nItemsCur = 0;
  local_a0 = (Abc_Obj_t *)Vec_PtrEntry(pVVar15,0);
  p_00 = Extra_ProgressBarStart((FILE *)_stdout,nCap);
  bVar30 = true;
  do {
    if (nCap <= nItemsCur) {
LAB_002e84a5:
      Extra_ProgressBarStop(p_00);
      if (nItemsCur != nCap) {
        __assert_fail("termCount==numTerms",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                      ,0x2fc,"Vec_Ptr_t *Io_NtkOrderingPads(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      if (p->nSize != uVar26) {
        __assert_fail("termsOnTop+termsOnBottom+termsOnLeft+termsOnRight == (unsigned)Vec_PtrSize(vOrderedTerms)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                      ,0x26d,"void Io_NtkWritePl(FILE *, Abc_Ntk_t *, unsigned int, double, double)"
                     );
      }
      puts("Done constructing layout region");
      printf("Terminals: %d\n",(ulong)uVar26);
      printf("  Top:     %d\n",uVar31);
      printf("  Bottom:  %d\n",uVar31);
      printf("  Left:    %d\n",(ulong)uVar27);
      printf("  Right:   %d\n",uVar18);
      fwrite("UCLA    pl    1.0\n\n",0x13,1,pFVar13);
      dVar32 = ceil(dVar6 + 2.0);
      dVar35 = dVar33 / (double)uVar31;
      dVar34 = 0.0;
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        plVar20 = (long *)Vec_PtrEntry(p,uVar7);
        bVar30 = (*(uint *)((long)plVar20 + 0x14) & 0xf) == 2;
        pcVar11 = "o%s_output\t\t";
        if (bVar30) {
          pcVar11 = "i%s_input\t\t";
        }
        pcVar21 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                               (long)*(int *)plVar20[(ulong)bVar30 * 2 + 4] * 8));
        fprintf(pFVar13,pcVar11,pcVar21);
        if ((uVar7 != 0) && ((int)dVar34 <= (int)(dVar34 - dVar35))) {
          dVar34 = dVar34 + 1.0;
        }
        fprintf(pFVar13,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar34,(ulong)(uint)(int)dVar32,
                "FS");
        dVar34 = dVar34 + dVar35;
      }
      dVar32 = 0.0;
      for (iVar24 = 0; uVar7 = uVar8 + iVar24, uVar7 < uVar8 * 2; iVar24 = iVar24 + 1) {
        plVar20 = (long *)Vec_PtrEntry(p,uVar7);
        bVar30 = (*(uint *)((long)plVar20 + 0x14) & 0xf) == 2;
        pcVar11 = "o%s_output\t\t";
        if (bVar30) {
          pcVar11 = "i%s_input\t\t";
        }
        pcVar21 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                               (long)*(int *)plVar20[(ulong)bVar30 * 2 + 4] * 8));
        fprintf(pFVar13,pcVar11,pcVar21);
        if ((iVar24 != 0) && ((int)dVar32 <= (int)(dVar32 - dVar35))) {
          dVar32 = dVar32 + 1.0;
        }
        fprintf(pFVar13,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar32,0xfffffffffffffffd,"N");
        dVar32 = dVar32 + dVar35;
      }
      dVar34 = dVar6 / (double)uVar27;
      dVar32 = 0.0;
      for (; uVar7 < uVar8 * 2 + uVar27; uVar7 = uVar7 + 1) {
        plVar20 = (long *)Vec_PtrEntry(p,uVar7);
        bVar30 = (*(uint *)((long)plVar20 + 0x14) & 0xf) == 2;
        pcVar11 = "o%s_output\t\t";
        if (bVar30) {
          pcVar11 = "i%s_input\t\t";
        }
        pcVar21 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                               (long)*(int *)plVar20[(ulong)bVar30 * 2 + 4] * 8));
        fprintf(pFVar13,pcVar11,pcVar21);
        uVar31 = -(ulong)((double)(int)dVar32 < (double)(int)(dVar32 - dVar34) + 1.0);
        dVar32 = (double)(~uVar31 & (ulong)dVar32 | (ulong)(dVar32 + 1.0) & uVar31);
        fprintf(pFVar13,"%d\t\t%d\t: %s /FIXED\n",0xfffffffffffffffd,(ulong)(uint)(int)dVar32,"E");
        dVar32 = dVar32 + dVar34;
      }
      dVar32 = ceil(dVar33 + 2.0);
      dVar6 = dVar6 / (double)(uVar18 & 0xffffffff);
      dVar33 = 0.0;
      for (; uVar7 < uVar26; uVar7 = uVar7 + 1) {
        plVar20 = (long *)Vec_PtrEntry(p,uVar7);
        bVar30 = (*(uint *)((long)plVar20 + 0x14) & 0xf) == 2;
        pcVar11 = "o%s_output\t\t";
        if (bVar30) {
          pcVar11 = "i%s_input\t\t";
        }
        pcVar21 = Abc_ObjName(*(Abc_Obj_t **)
                               (*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                               (long)*(int *)plVar20[(ulong)bVar30 * 2 + 4] * 8));
        fprintf(pFVar13,pcVar11,pcVar21);
        uVar31 = -(ulong)((double)(int)dVar33 < (double)(int)(dVar33 - dVar6) + 1.0);
        dVar33 = (double)(~uVar31 & (ulong)dVar33 | (ulong)(dVar33 + 1.0) & uVar31);
        fprintf(pFVar13,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar32,(ulong)(uint)(int)dVar33,
                "FW");
        dVar33 = dVar33 + dVar6;
      }
      if (pNtk->nObjCounts[8] != 0) {
        for (iVar24 = 0; iVar24 < pNtk->vBoxes->nSize; iVar24 = iVar24 + 1) {
          pAVar16 = Abc_NtkBox(pNtk,iVar24);
          if ((*(uint *)&pAVar16->field_0x14 & 0xf) == 8) {
            Io_NtkWriteLatchNode((FILE *)pFVar13,pAVar16,1);
            fprintf(pFVar13,"\t%d\t\t%d\t: %s\n",0,0,"N");
          }
        }
      }
      for (iVar24 = 0; iVar24 < pNtk->vObjs->nSize; iVar24 = iVar24 + 1) {
        pAVar16 = Abc_NtkObj(pNtk,iVar24);
        if ((pAVar16 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar16->field_0x14 & 0xf) == 7)) {
          Io_NtkWriteIntNode((FILE *)pFVar13,pAVar16,1);
          fprintf(pFVar13,"\t%d\t\t%d\t: %s\n",0,0,"N");
        }
      }
      fclose(pFVar12);
      fclose(pFVar13);
      fclose(pFVar14);
      return;
    }
    while( true ) {
      if (nCap <= uVar7) goto LAB_002e84a5;
      if (bVar30 || *(int *)((long)pvVar17 + (ulong)(uint)local_a0->Id * 4) == 0) break;
      local_a0 = (Abc_Obj_t *)Vec_PtrEntry(pVVar15,uVar7);
      bVar30 = false;
      uVar7 = uVar7 + 1;
    }
    iVar24 = Vec_PtrPushUnique(p,local_a0);
    if (iVar24 == 0) {
      *(undefined4 *)((long)pvVar17 + (ulong)(uint)local_a0->Id * 4) = 1;
      nItemsCur = nItemsCur + 1;
    }
    p_01 = Vec_PtrAlloc(nCap);
    if ((*(uint *)&local_a0->field_0x14 & 0xe) != 2) {
      __assert_fail("Abc_ObjIsPi(pTerm) || Abc_ObjIsPo(pTerm)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                    ,0x312,"Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)"
                   );
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      uVar28 = pNtk->vObjs->nSize + 500;
      Vec_IntGrow(&pNtk->vTravIds,uVar28);
      uVar19 = 0;
      if (0 < (int)uVar28) {
        uVar19 = (ulong)uVar28;
      }
      for (uVar22 = 0; uVar19 != uVar22; uVar22 = uVar22 + 1) {
        (pNtk->vTravIds).pArray[uVar22] = 0;
      }
      (pNtk->vTravIds).nSize = uVar28;
    }
    iVar24 = pNtk->nTravIds;
    pNtk->nTravIds = iVar24 + 1;
    if (0x3ffffffe < iVar24) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    Abc_NodeSetTravIdCurrent(local_a0);
    ppvVar4 = local_a0->pNtk->vObjs->pArray;
    if ((*(uint *)&local_a0->field_0x14 & 0xf) == 2) {
      plVar20 = (long *)ppvVar4[*(local_a0->vFanouts).pArray];
      for (lVar29 = 0; lVar29 < *(int *)((long)plVar20 + 0x2c); lVar29 = lVar29 + 1) {
        Vec_PtrPush(p_01,*(void **)(*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                                   (long)*(int *)(plVar20[6] + lVar29 * 4) * 8));
      }
    }
    else {
      plVar20 = (long *)ppvVar4[*(local_a0->vFanins).pArray];
      for (lVar29 = 0; lVar29 < *(int *)((long)plVar20 + 0x1c); lVar29 = lVar29 + 1) {
        Vec_PtrPush(p_01,*(void **)(*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                                   (long)*(int *)(plVar20[4] + lVar29 * 4) * 8));
      }
    }
    while( true ) {
      uVar28 = p_01->nSize;
      pAVar16 = local_a0;
      if ((int)uVar28 < 1) break;
      pAVar16 = (Abc_Obj_t *)Vec_PtrEntry(p_01,0);
      uVar9 = *(uint *)&pAVar16->field_0x14 & 0xf;
      if ((7 < uVar9) || ((0xbcU >> uVar9 & 1) == 0)) {
        __assert_fail("Abc_ObjIsNode(pNeighbor) || Abc_ObjIsTerm(pNeighbor)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBook.c"
                      ,0x325,
                      "Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)");
      }
      lVar29 = (ulong)uVar28 * 8;
      uVar19 = (ulong)uVar28;
      do {
        uVar22 = uVar19;
        lVar25 = lVar29;
        if ((int)uVar22 < 1) {
          __assert_fail("i >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x304,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
        }
        lVar29 = lVar25 + -8;
        uVar19 = uVar22 - 1;
      } while ((Abc_Obj_t *)p_01->pArray[uVar22 - 1] != pAVar16);
      puVar23 = (undefined8 *)((long)p_01->pArray + lVar25);
      for (; (int)uVar22 < (int)uVar28; uVar22 = (ulong)((int)uVar22 + 1)) {
        puVar23[-1] = *puVar23;
        puVar23 = puVar23 + 1;
      }
      p_01->nSize = uVar28 - 1;
      iVar24 = Abc_NodeIsTravIdCurrent(pAVar16);
      if (iVar24 == 0) {
        Abc_NodeSetTravIdCurrent(pAVar16);
        if (((*(uint *)&pAVar16->field_0x14 & 0xe) == 2) &&
           (*(int *)((long)pvVar17 + (ulong)(uint)pAVar16->Id * 4) == 0)) break;
        if ((pAVar16->vFanouts).nSize != 0) {
          plVar20 = (long *)pAVar16->pNtk->vObjs->pArray[*(pAVar16->vFanouts).pArray];
          if ((pNtk->nObjCounts[8] != 0) && ((*(uint *)((long)plVar20 + 0x14) & 0xf) == 8)) {
            plVar20 = *(long **)(*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                                (long)*(int *)plVar20[6] * 8);
            plVar20 = *(long **)(*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                                (long)*(int *)plVar20[6] * 8);
          }
          for (lVar29 = 0; lVar29 < *(int *)((long)plVar20 + 0x2c); lVar29 = lVar29 + 1) {
            pAVar5 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar20 + 0x20) + 8) +
                      (long)*(int *)(plVar20[6] + lVar29 * 4) * 8);
            iVar24 = Abc_NodeIsTravIdCurrent(pAVar5);
            if (iVar24 == 0) {
              Vec_PtrPush(p_01,pAVar5);
            }
          }
        }
        if ((pAVar16->vFanins).nSize != 0) {
          if ((pNtk->nObjCounts[8] != 0) &&
             (plVar20 = (long *)pAVar16->pNtk->vObjs->pArray[*(pAVar16->vFanins).pArray],
             (*(uint *)((long)plVar20 + 0x14) & 0xf) == 8)) {
            pAVar16 = *(Abc_Obj_t **)
                       (*(long *)(*(long *)(*plVar20 + 0x20) + 8) + (long)*(int *)plVar20[4] * 8);
          }
          for (lVar29 = 0; lVar29 < (pAVar16->vFanins).nSize; lVar29 = lVar29 + 1) {
            plVar20 = (long *)pAVar16->pNtk->vObjs->pArray[(pAVar16->vFanins).pArray[lVar29]];
            pAVar5 = *(Abc_Obj_t **)
                      (*(long *)(*(long *)(*plVar20 + 0x20) + 8) + (long)*(int *)plVar20[4] * 8);
            iVar24 = Abc_NodeIsTravIdCurrent(pAVar5);
            if (iVar24 == 0) {
              Vec_PtrPush(p_01,pAVar5);
            }
          }
        }
      }
    }
    iVar24 = Vec_PtrPushUnique(p,pAVar16);
    bVar30 = iVar24 == 0;
    if (bVar30) {
      *(undefined4 *)((long)pvVar17 + (ulong)(uint)pAVar16->Id * 4) = 1;
      nItemsCur = nItemsCur + 1;
      pcVar11 = extraout_RDX;
      local_a0 = pAVar16;
    }
    else {
      local_a0 = (Abc_Obj_t *)Vec_PtrEntry(pVVar15,uVar7);
      pcVar11 = extraout_RDX_00;
      uVar7 = uVar7 + 1;
    }
    Extra_ProgressBarUpdate(p_00,nItemsCur,pcVar11);
  } while( true );
}

Assistant:

void Io_WriteBook( Abc_Ntk_t * pNtk, char * FileName )
{

    FILE * pFileNodes, * pFileNets, * pFileAux;
    FILE * pFileScl, * pFilePl, * pFileWts;
    char * FileExt = ABC_CALLOC( char, strlen(FileName)+7 );
    unsigned coreCellArea=0;
    Abc_Ntk_t * pExdc, * pNtkTemp;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the files
    strcpy(FileExt, FileName);
    pFileNodes = fopen( strcat(FileExt,".nodes"), "w" );
    strcpy(FileExt, FileName);
    pFileNets  = fopen( strcat(FileExt,".nets"), "w" );
    strcpy(FileExt, FileName);
    pFileAux   = fopen( strcat(FileExt,".aux"), "w" );

        // write the aux file
    if ( (pFileNodes == NULL) || (pFileNets == NULL) || (pFileAux == NULL) )
    {
        fclose( pFileAux );
        fprintf( stdout, "Io_WriteBook(): Cannot open the output files.\n" );
        return;
    }
    fprintf( pFileAux, "RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts", 
         FileName, FileName, FileName, FileName, FileName );
    fclose( pFileAux );

    // write the master network
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
    Io_NtkWriteNets( pFileNets, pNtk );

    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
    {
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
        Io_NtkWriteNets( pFileNets, pNtk );
    }

    // make sure there is no logic hierarchy
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );

    // write the hierarchy if present
    if ( Abc_NtkBlackboxNum(pNtk) > 0 )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtkTemp );
            Io_NtkWriteNets( pFileNets, pNtkTemp );
        }
    }
    fclose( pFileNodes );
    fclose( pFileNets );

    strcpy(FileExt, FileName);
    pFileScl = fopen( strcat(FileExt,".scl"), "w" );
    strcpy(FileExt, FileName);
    pFilePl  = fopen( strcat(FileExt,".pl"), "w" );
    strcpy(FileExt, FileName);
    pFileWts   = fopen( strcat(FileExt,".wts"), "w" );
    ABC_FREE(FileExt);

    Io_NtkBuildLayout( pFileScl, pFilePl, pNtk, 1.0, 10, coreCellArea );
    fclose( pFileScl );
    fclose( pFilePl );
    fclose( pFileWts );
}